

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

MV clamp_mv_to_umv_border_sb(MACROBLOCKD *xd,MV *src_mv,int bw,int bh,int ss_x,int ss_y)

{
  int in_ECX;
  int in_EDX;
  short *in_RSI;
  long in_RDI;
  char in_R8B;
  char in_R9B;
  SubpelMvLimits mv_limits;
  int spel_bottom;
  int spel_top;
  int spel_right;
  int spel_left;
  MV clamped_mv;
  MV local_4;
  
  local_4.col = in_RSI[1] * (short)(1 << (1U - in_R8B & 0x1f));
  local_4.row = *in_RSI * (short)(1 << (1U - in_R9B & 0x1f));
  clamp_mv((MV *)CONCAT44(*(int *)(in_RDI + 0x1f00) * (1 << (1U - in_R9B & 0x1f)) +
                          (in_ECX + 4) * 0x10 + -0x10,
                          *(int *)(in_RDI + 0x1efc) * (1 << (1U - in_R9B & 0x1f)) +
                          (in_ECX + 4) * -0x10),
           (SubpelMvLimits *)
           CONCAT44(*(int *)(in_RDI + 0x1ef8) * (1 << (1U - in_R8B & 0x1f)) +
                    (in_EDX + 4) * 0x10 + -0x10,
                    *(int *)(in_RDI + 0x1ef4) * (1 << (1U - in_R8B & 0x1f)) + (in_EDX + 4) * -0x10))
  ;
  return local_4;
}

Assistant:

static inline MV clamp_mv_to_umv_border_sb(const MACROBLOCKD *xd,
                                           const MV *src_mv, int bw, int bh,
                                           int ss_x, int ss_y) {
  // If the MV points so far into the UMV border that no visible pixels
  // are used for reconstruction, the subpel part of the MV can be
  // discarded and the MV limited to 16 pixels with equivalent results.
  const int spel_left = (AOM_INTERP_EXTEND + bw) << SUBPEL_BITS;
  const int spel_right = spel_left - SUBPEL_SHIFTS;
  const int spel_top = (AOM_INTERP_EXTEND + bh) << SUBPEL_BITS;
  const int spel_bottom = spel_top - SUBPEL_SHIFTS;
  MV clamped_mv = { (int16_t)(src_mv->row * (1 << (1 - ss_y))),
                    (int16_t)(src_mv->col * (1 << (1 - ss_x))) };
  assert(ss_x <= 1);
  assert(ss_y <= 1);
  const SubpelMvLimits mv_limits = {
    xd->mb_to_left_edge * (1 << (1 - ss_x)) - spel_left,
    xd->mb_to_right_edge * (1 << (1 - ss_x)) + spel_right,
    xd->mb_to_top_edge * (1 << (1 - ss_y)) - spel_top,
    xd->mb_to_bottom_edge * (1 << (1 - ss_y)) + spel_bottom
  };

  clamp_mv(&clamped_mv, &mv_limits);

  return clamped_mv;
}